

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O0

void blake2b_compress(blake2b_state *S,void *block,uint64_t f0)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint64_t v [16];
  uint64_t m [16];
  uint64_t f0_local;
  void *block_local;
  blake2b_state *S_local;
  
  uVar1 = load64(block);
  uVar2 = load64((void *)((long)block + 8));
  uVar3 = load64((void *)((long)block + 0x10));
  uVar4 = load64((void *)((long)block + 0x18));
  uVar5 = load64((void *)((long)block + 0x20));
  uVar6 = load64((void *)((long)block + 0x28));
  uVar7 = load64((void *)((long)block + 0x30));
  uVar8 = load64((void *)((long)block + 0x38));
  uVar9 = load64((void *)((long)block + 0x40));
  uVar10 = load64((void *)((long)block + 0x48));
  uVar11 = load64((void *)((long)block + 0x50));
  uVar12 = load64((void *)((long)block + 0x58));
  uVar13 = load64((void *)((long)block + 0x60));
  uVar14 = load64((void *)((long)block + 0x68));
  uVar15 = load64((void *)((long)block + 0x70));
  uVar16 = load64((void *)((long)block + 0x78));
  uVar21 = S->h[4];
  uVar24 = S->h[5];
  uVar28 = S->h[6];
  uVar32 = S->h[7];
  uVar17 = S->t[0] ^ 0x510e527fade682d1;
  uVar18 = S->t[1] ^ 0x9b05688c2b3e6c1f;
  uVar19 = S->h[0] + uVar21 + uVar1;
  uVar17 = (uVar17 ^ uVar19) >> 0x20 | (uVar17 ^ uVar19) << 0x20;
  uVar20 = uVar17 + 0x6a09e667f3bcc908;
  uVar21 = (uVar21 ^ uVar20) >> 0x18 | (uVar21 ^ uVar20) << 0x28;
  uVar19 = uVar19 + uVar21 + uVar2;
  uVar17 = (uVar17 ^ uVar19) >> 0x10 | (uVar17 ^ uVar19) << 0x30;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x3f | (uVar21 ^ uVar20) << 1;
  uVar22 = S->h[1] + uVar24 + uVar3;
  uVar18 = (uVar18 ^ uVar22) >> 0x20 | (uVar18 ^ uVar22) << 0x20;
  uVar23 = uVar18 + 0xbb67ae8584caa73b;
  uVar24 = (uVar24 ^ uVar23) >> 0x18 | (uVar24 ^ uVar23) << 0x28;
  uVar22 = uVar22 + uVar24 + uVar4;
  uVar18 = (uVar18 ^ uVar22) >> 0x10 | (uVar18 ^ uVar22) << 0x30;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x3f | (uVar24 ^ uVar23) << 1;
  uVar25 = S->h[2] + uVar28 + uVar5;
  uVar26 = (f0 ^ 0x1f83d9abfb41bd6b ^ uVar25) >> 0x20 | (f0 ^ 0x1f83d9abfb41bd6b ^ uVar25) << 0x20;
  uVar27 = uVar26 + 0x3c6ef372fe94f82b;
  uVar28 = (uVar28 ^ uVar27) >> 0x18 | (uVar28 ^ uVar27) << 0x28;
  uVar25 = uVar25 + uVar28 + uVar6;
  uVar26 = (uVar26 ^ uVar25) >> 0x10 | (uVar26 ^ uVar25) << 0x30;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x3f | (uVar28 ^ uVar27) << 1;
  uVar29 = S->h[3] + uVar32 + uVar7;
  uVar30 = (uVar29 ^ 0x5be0cd19137e2179) >> 0x20 | (uVar29 ^ 0x5be0cd19137e2179) << 0x20;
  uVar31 = uVar30 + 0xa54ff53a5f1d36f1;
  uVar32 = (uVar32 ^ uVar31) >> 0x18 | (uVar32 ^ uVar31) << 0x28;
  uVar29 = uVar29 + uVar32 + uVar8;
  uVar30 = (uVar30 ^ uVar29) >> 0x10 | (uVar30 ^ uVar29) << 0x30;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x3f | (uVar32 ^ uVar31) << 1;
  uVar19 = uVar19 + uVar24 + uVar9;
  uVar30 = (uVar30 ^ uVar19) >> 0x20 | (uVar30 ^ uVar19) << 0x20;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x18 | (uVar24 ^ uVar27) << 0x28;
  uVar19 = uVar19 + uVar24 + uVar10;
  uVar30 = (uVar30 ^ uVar19) >> 0x10 | (uVar30 ^ uVar19) << 0x30;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x3f | (uVar24 ^ uVar27) << 1;
  uVar22 = uVar22 + uVar28 + uVar11;
  uVar17 = (uVar17 ^ uVar22) >> 0x20 | (uVar17 ^ uVar22) << 0x20;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x18 | (uVar28 ^ uVar31) << 0x28;
  uVar22 = uVar22 + uVar28 + uVar12;
  uVar17 = (uVar17 ^ uVar22) >> 0x10 | (uVar17 ^ uVar22) << 0x30;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x3f | (uVar28 ^ uVar31) << 1;
  uVar25 = uVar25 + uVar32 + uVar13;
  uVar18 = (uVar18 ^ uVar25) >> 0x20 | (uVar18 ^ uVar25) << 0x20;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x18 | (uVar32 ^ uVar20) << 0x28;
  uVar25 = uVar25 + uVar32 + uVar14;
  uVar18 = (uVar18 ^ uVar25) >> 0x10 | (uVar18 ^ uVar25) << 0x30;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x3f | (uVar32 ^ uVar20) << 1;
  uVar29 = uVar29 + uVar21 + uVar15;
  uVar26 = (uVar26 ^ uVar29) >> 0x20 | (uVar26 ^ uVar29) << 0x20;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x18 | (uVar21 ^ uVar23) << 0x28;
  uVar29 = uVar29 + uVar21 + uVar16;
  uVar26 = (uVar26 ^ uVar29) >> 0x10 | (uVar26 ^ uVar29) << 0x30;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x3f | (uVar21 ^ uVar23) << 1;
  uVar19 = uVar19 + uVar21 + uVar15;
  uVar17 = (uVar17 ^ uVar19) >> 0x20 | (uVar17 ^ uVar19) << 0x20;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x18 | (uVar21 ^ uVar20) << 0x28;
  uVar19 = uVar19 + uVar21 + uVar11;
  uVar17 = (uVar17 ^ uVar19) >> 0x10 | (uVar17 ^ uVar19) << 0x30;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x3f | (uVar21 ^ uVar20) << 1;
  uVar22 = uVar22 + uVar24 + uVar5;
  uVar18 = (uVar18 ^ uVar22) >> 0x20 | (uVar18 ^ uVar22) << 0x20;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x18 | (uVar24 ^ uVar23) << 0x28;
  uVar22 = uVar22 + uVar24 + uVar9;
  uVar18 = (uVar18 ^ uVar22) >> 0x10 | (uVar18 ^ uVar22) << 0x30;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x3f | (uVar24 ^ uVar23) << 1;
  uVar25 = uVar25 + uVar28 + uVar10;
  uVar26 = (uVar26 ^ uVar25) >> 0x20 | (uVar26 ^ uVar25) << 0x20;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x18 | (uVar28 ^ uVar27) << 0x28;
  uVar25 = uVar25 + uVar28 + uVar16;
  uVar26 = (uVar26 ^ uVar25) >> 0x10 | (uVar26 ^ uVar25) << 0x30;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x3f | (uVar28 ^ uVar27) << 1;
  uVar29 = uVar29 + uVar32 + uVar14;
  uVar30 = (uVar30 ^ uVar29) >> 0x20 | (uVar30 ^ uVar29) << 0x20;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x18 | (uVar32 ^ uVar31) << 0x28;
  uVar29 = uVar29 + uVar32 + uVar7;
  uVar30 = (uVar30 ^ uVar29) >> 0x10 | (uVar30 ^ uVar29) << 0x30;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x3f | (uVar32 ^ uVar31) << 1;
  uVar19 = uVar19 + uVar24 + uVar2;
  uVar30 = (uVar30 ^ uVar19) >> 0x20 | (uVar30 ^ uVar19) << 0x20;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x18 | (uVar24 ^ uVar27) << 0x28;
  uVar19 = uVar19 + uVar24 + uVar13;
  uVar30 = (uVar30 ^ uVar19) >> 0x10 | (uVar30 ^ uVar19) << 0x30;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x3f | (uVar24 ^ uVar27) << 1;
  uVar22 = uVar22 + uVar28 + uVar1;
  uVar17 = (uVar17 ^ uVar22) >> 0x20 | (uVar17 ^ uVar22) << 0x20;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x18 | (uVar28 ^ uVar31) << 0x28;
  uVar22 = uVar22 + uVar28 + uVar3;
  uVar17 = (uVar17 ^ uVar22) >> 0x10 | (uVar17 ^ uVar22) << 0x30;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x3f | (uVar28 ^ uVar31) << 1;
  uVar25 = uVar25 + uVar32 + uVar12;
  uVar18 = (uVar18 ^ uVar25) >> 0x20 | (uVar18 ^ uVar25) << 0x20;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x18 | (uVar32 ^ uVar20) << 0x28;
  uVar25 = uVar25 + uVar32 + uVar8;
  uVar18 = (uVar18 ^ uVar25) >> 0x10 | (uVar18 ^ uVar25) << 0x30;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x3f | (uVar32 ^ uVar20) << 1;
  uVar29 = uVar29 + uVar21 + uVar6;
  uVar26 = (uVar26 ^ uVar29) >> 0x20 | (uVar26 ^ uVar29) << 0x20;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x18 | (uVar21 ^ uVar23) << 0x28;
  uVar29 = uVar29 + uVar21 + uVar4;
  uVar26 = (uVar26 ^ uVar29) >> 0x10 | (uVar26 ^ uVar29) << 0x30;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x3f | (uVar21 ^ uVar23) << 1;
  uVar19 = uVar19 + uVar21 + uVar12;
  uVar17 = (uVar17 ^ uVar19) >> 0x20 | (uVar17 ^ uVar19) << 0x20;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x18 | (uVar21 ^ uVar20) << 0x28;
  uVar19 = uVar19 + uVar21 + uVar9;
  uVar17 = (uVar17 ^ uVar19) >> 0x10 | (uVar17 ^ uVar19) << 0x30;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x3f | (uVar21 ^ uVar20) << 1;
  uVar22 = uVar22 + uVar24 + uVar13;
  uVar18 = (uVar18 ^ uVar22) >> 0x20 | (uVar18 ^ uVar22) << 0x20;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x18 | (uVar24 ^ uVar23) << 0x28;
  uVar22 = uVar22 + uVar24 + uVar1;
  uVar18 = (uVar18 ^ uVar22) >> 0x10 | (uVar18 ^ uVar22) << 0x30;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x3f | (uVar24 ^ uVar23) << 1;
  uVar25 = uVar25 + uVar28 + uVar6;
  uVar26 = (uVar26 ^ uVar25) >> 0x20 | (uVar26 ^ uVar25) << 0x20;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x18 | (uVar28 ^ uVar27) << 0x28;
  uVar25 = uVar25 + uVar28 + uVar3;
  uVar26 = (uVar26 ^ uVar25) >> 0x10 | (uVar26 ^ uVar25) << 0x30;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x3f | (uVar28 ^ uVar27) << 1;
  uVar29 = uVar29 + uVar32 + uVar16;
  uVar30 = (uVar30 ^ uVar29) >> 0x20 | (uVar30 ^ uVar29) << 0x20;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x18 | (uVar32 ^ uVar31) << 0x28;
  uVar29 = uVar29 + uVar32 + uVar14;
  uVar30 = (uVar30 ^ uVar29) >> 0x10 | (uVar30 ^ uVar29) << 0x30;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x3f | (uVar32 ^ uVar31) << 1;
  uVar19 = uVar19 + uVar24 + uVar11;
  uVar30 = (uVar30 ^ uVar19) >> 0x20 | (uVar30 ^ uVar19) << 0x20;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x18 | (uVar24 ^ uVar27) << 0x28;
  uVar19 = uVar19 + uVar24 + uVar15;
  uVar30 = (uVar30 ^ uVar19) >> 0x10 | (uVar30 ^ uVar19) << 0x30;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x3f | (uVar24 ^ uVar27) << 1;
  uVar22 = uVar22 + uVar28 + uVar4;
  uVar17 = (uVar17 ^ uVar22) >> 0x20 | (uVar17 ^ uVar22) << 0x20;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x18 | (uVar28 ^ uVar31) << 0x28;
  uVar22 = uVar22 + uVar28 + uVar7;
  uVar17 = (uVar17 ^ uVar22) >> 0x10 | (uVar17 ^ uVar22) << 0x30;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x3f | (uVar28 ^ uVar31) << 1;
  uVar25 = uVar25 + uVar32 + uVar8;
  uVar18 = (uVar18 ^ uVar25) >> 0x20 | (uVar18 ^ uVar25) << 0x20;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x18 | (uVar32 ^ uVar20) << 0x28;
  uVar25 = uVar25 + uVar32 + uVar2;
  uVar18 = (uVar18 ^ uVar25) >> 0x10 | (uVar18 ^ uVar25) << 0x30;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x3f | (uVar32 ^ uVar20) << 1;
  uVar29 = uVar29 + uVar21 + uVar10;
  uVar26 = (uVar26 ^ uVar29) >> 0x20 | (uVar26 ^ uVar29) << 0x20;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x18 | (uVar21 ^ uVar23) << 0x28;
  uVar29 = uVar29 + uVar21 + uVar5;
  uVar26 = (uVar26 ^ uVar29) >> 0x10 | (uVar26 ^ uVar29) << 0x30;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x3f | (uVar21 ^ uVar23) << 1;
  uVar19 = uVar19 + uVar21 + uVar8;
  uVar17 = (uVar17 ^ uVar19) >> 0x20 | (uVar17 ^ uVar19) << 0x20;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x18 | (uVar21 ^ uVar20) << 0x28;
  uVar19 = uVar19 + uVar21 + uVar10;
  uVar17 = (uVar17 ^ uVar19) >> 0x10 | (uVar17 ^ uVar19) << 0x30;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x3f | (uVar21 ^ uVar20) << 1;
  uVar22 = uVar22 + uVar24 + uVar4;
  uVar18 = (uVar18 ^ uVar22) >> 0x20 | (uVar18 ^ uVar22) << 0x20;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x18 | (uVar24 ^ uVar23) << 0x28;
  uVar22 = uVar22 + uVar24 + uVar2;
  uVar18 = (uVar18 ^ uVar22) >> 0x10 | (uVar18 ^ uVar22) << 0x30;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x3f | (uVar24 ^ uVar23) << 1;
  uVar25 = uVar25 + uVar28 + uVar14;
  uVar26 = (uVar26 ^ uVar25) >> 0x20 | (uVar26 ^ uVar25) << 0x20;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x18 | (uVar28 ^ uVar27) << 0x28;
  uVar25 = uVar25 + uVar28 + uVar13;
  uVar26 = (uVar26 ^ uVar25) >> 0x10 | (uVar26 ^ uVar25) << 0x30;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x3f | (uVar28 ^ uVar27) << 1;
  uVar29 = uVar29 + uVar32 + uVar12;
  uVar30 = (uVar30 ^ uVar29) >> 0x20 | (uVar30 ^ uVar29) << 0x20;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x18 | (uVar32 ^ uVar31) << 0x28;
  uVar29 = uVar29 + uVar32 + uVar15;
  uVar30 = (uVar30 ^ uVar29) >> 0x10 | (uVar30 ^ uVar29) << 0x30;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x3f | (uVar32 ^ uVar31) << 1;
  uVar19 = uVar19 + uVar24 + uVar3;
  uVar30 = (uVar30 ^ uVar19) >> 0x20 | (uVar30 ^ uVar19) << 0x20;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x18 | (uVar24 ^ uVar27) << 0x28;
  uVar19 = uVar19 + uVar24 + uVar7;
  uVar30 = (uVar30 ^ uVar19) >> 0x10 | (uVar30 ^ uVar19) << 0x30;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x3f | (uVar24 ^ uVar27) << 1;
  uVar22 = uVar22 + uVar28 + uVar6;
  uVar17 = (uVar17 ^ uVar22) >> 0x20 | (uVar17 ^ uVar22) << 0x20;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x18 | (uVar28 ^ uVar31) << 0x28;
  uVar22 = uVar22 + uVar28 + uVar11;
  uVar17 = (uVar17 ^ uVar22) >> 0x10 | (uVar17 ^ uVar22) << 0x30;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x3f | (uVar28 ^ uVar31) << 1;
  uVar25 = uVar25 + uVar32 + uVar5;
  uVar18 = (uVar18 ^ uVar25) >> 0x20 | (uVar18 ^ uVar25) << 0x20;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x18 | (uVar32 ^ uVar20) << 0x28;
  uVar25 = uVar25 + uVar32 + uVar1;
  uVar18 = (uVar18 ^ uVar25) >> 0x10 | (uVar18 ^ uVar25) << 0x30;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x3f | (uVar32 ^ uVar20) << 1;
  uVar29 = uVar29 + uVar21 + uVar16;
  uVar26 = (uVar26 ^ uVar29) >> 0x20 | (uVar26 ^ uVar29) << 0x20;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x18 | (uVar21 ^ uVar23) << 0x28;
  uVar29 = uVar29 + uVar21 + uVar9;
  uVar26 = (uVar26 ^ uVar29) >> 0x10 | (uVar26 ^ uVar29) << 0x30;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x3f | (uVar21 ^ uVar23) << 1;
  uVar19 = uVar19 + uVar21 + uVar10;
  uVar17 = (uVar17 ^ uVar19) >> 0x20 | (uVar17 ^ uVar19) << 0x20;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x18 | (uVar21 ^ uVar20) << 0x28;
  uVar19 = uVar19 + uVar21 + uVar1;
  uVar17 = (uVar17 ^ uVar19) >> 0x10 | (uVar17 ^ uVar19) << 0x30;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x3f | (uVar21 ^ uVar20) << 1;
  uVar22 = uVar22 + uVar24 + uVar6;
  uVar18 = (uVar18 ^ uVar22) >> 0x20 | (uVar18 ^ uVar22) << 0x20;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x18 | (uVar24 ^ uVar23) << 0x28;
  uVar22 = uVar22 + uVar24 + uVar8;
  uVar18 = (uVar18 ^ uVar22) >> 0x10 | (uVar18 ^ uVar22) << 0x30;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x3f | (uVar24 ^ uVar23) << 1;
  uVar25 = uVar25 + uVar28 + uVar3;
  uVar26 = (uVar26 ^ uVar25) >> 0x20 | (uVar26 ^ uVar25) << 0x20;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x18 | (uVar28 ^ uVar27) << 0x28;
  uVar25 = uVar25 + uVar28 + uVar5;
  uVar26 = (uVar26 ^ uVar25) >> 0x10 | (uVar26 ^ uVar25) << 0x30;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x3f | (uVar28 ^ uVar27) << 1;
  uVar29 = uVar29 + uVar32 + uVar11;
  uVar30 = (uVar30 ^ uVar29) >> 0x20 | (uVar30 ^ uVar29) << 0x20;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x18 | (uVar32 ^ uVar31) << 0x28;
  uVar29 = uVar29 + uVar32 + uVar16;
  uVar30 = (uVar30 ^ uVar29) >> 0x10 | (uVar30 ^ uVar29) << 0x30;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x3f | (uVar32 ^ uVar31) << 1;
  uVar19 = uVar19 + uVar24 + uVar15;
  uVar30 = (uVar30 ^ uVar19) >> 0x20 | (uVar30 ^ uVar19) << 0x20;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x18 | (uVar24 ^ uVar27) << 0x28;
  uVar19 = uVar19 + uVar24 + uVar2;
  uVar30 = (uVar30 ^ uVar19) >> 0x10 | (uVar30 ^ uVar19) << 0x30;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x3f | (uVar24 ^ uVar27) << 1;
  uVar22 = uVar22 + uVar28 + uVar12;
  uVar17 = (uVar17 ^ uVar22) >> 0x20 | (uVar17 ^ uVar22) << 0x20;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x18 | (uVar28 ^ uVar31) << 0x28;
  uVar22 = uVar22 + uVar28 + uVar13;
  uVar17 = (uVar17 ^ uVar22) >> 0x10 | (uVar17 ^ uVar22) << 0x30;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x3f | (uVar28 ^ uVar31) << 1;
  uVar25 = uVar25 + uVar32 + uVar7;
  uVar18 = (uVar18 ^ uVar25) >> 0x20 | (uVar18 ^ uVar25) << 0x20;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x18 | (uVar32 ^ uVar20) << 0x28;
  uVar25 = uVar25 + uVar32 + uVar9;
  uVar18 = (uVar18 ^ uVar25) >> 0x10 | (uVar18 ^ uVar25) << 0x30;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x3f | (uVar32 ^ uVar20) << 1;
  uVar29 = uVar29 + uVar21 + uVar4;
  uVar26 = (uVar26 ^ uVar29) >> 0x20 | (uVar26 ^ uVar29) << 0x20;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x18 | (uVar21 ^ uVar23) << 0x28;
  uVar29 = uVar29 + uVar21 + uVar14;
  uVar26 = (uVar26 ^ uVar29) >> 0x10 | (uVar26 ^ uVar29) << 0x30;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x3f | (uVar21 ^ uVar23) << 1;
  uVar19 = uVar19 + uVar21 + uVar3;
  uVar17 = (uVar17 ^ uVar19) >> 0x20 | (uVar17 ^ uVar19) << 0x20;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x18 | (uVar21 ^ uVar20) << 0x28;
  uVar19 = uVar19 + uVar21 + uVar13;
  uVar17 = (uVar17 ^ uVar19) >> 0x10 | (uVar17 ^ uVar19) << 0x30;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x3f | (uVar21 ^ uVar20) << 1;
  uVar22 = uVar22 + uVar24 + uVar7;
  uVar18 = (uVar18 ^ uVar22) >> 0x20 | (uVar18 ^ uVar22) << 0x20;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x18 | (uVar24 ^ uVar23) << 0x28;
  uVar22 = uVar22 + uVar24 + uVar11;
  uVar18 = (uVar18 ^ uVar22) >> 0x10 | (uVar18 ^ uVar22) << 0x30;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x3f | (uVar24 ^ uVar23) << 1;
  uVar25 = uVar25 + uVar28 + uVar1;
  uVar26 = (uVar26 ^ uVar25) >> 0x20 | (uVar26 ^ uVar25) << 0x20;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x18 | (uVar28 ^ uVar27) << 0x28;
  uVar25 = uVar25 + uVar28 + uVar12;
  uVar26 = (uVar26 ^ uVar25) >> 0x10 | (uVar26 ^ uVar25) << 0x30;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x3f | (uVar28 ^ uVar27) << 1;
  uVar29 = uVar29 + uVar32 + uVar9;
  uVar30 = (uVar30 ^ uVar29) >> 0x20 | (uVar30 ^ uVar29) << 0x20;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x18 | (uVar32 ^ uVar31) << 0x28;
  uVar29 = uVar29 + uVar32 + uVar4;
  uVar30 = (uVar30 ^ uVar29) >> 0x10 | (uVar30 ^ uVar29) << 0x30;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x3f | (uVar32 ^ uVar31) << 1;
  uVar19 = uVar19 + uVar24 + uVar5;
  uVar30 = (uVar30 ^ uVar19) >> 0x20 | (uVar30 ^ uVar19) << 0x20;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x18 | (uVar24 ^ uVar27) << 0x28;
  uVar19 = uVar19 + uVar24 + uVar14;
  uVar30 = (uVar30 ^ uVar19) >> 0x10 | (uVar30 ^ uVar19) << 0x30;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x3f | (uVar24 ^ uVar27) << 1;
  uVar22 = uVar22 + uVar28 + uVar8;
  uVar17 = (uVar17 ^ uVar22) >> 0x20 | (uVar17 ^ uVar22) << 0x20;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x18 | (uVar28 ^ uVar31) << 0x28;
  uVar22 = uVar22 + uVar28 + uVar6;
  uVar17 = (uVar17 ^ uVar22) >> 0x10 | (uVar17 ^ uVar22) << 0x30;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x3f | (uVar28 ^ uVar31) << 1;
  uVar25 = uVar25 + uVar32 + uVar16;
  uVar18 = (uVar18 ^ uVar25) >> 0x20 | (uVar18 ^ uVar25) << 0x20;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x18 | (uVar32 ^ uVar20) << 0x28;
  uVar25 = uVar25 + uVar32 + uVar15;
  uVar18 = (uVar18 ^ uVar25) >> 0x10 | (uVar18 ^ uVar25) << 0x30;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x3f | (uVar32 ^ uVar20) << 1;
  uVar29 = uVar29 + uVar21 + uVar2;
  uVar26 = (uVar26 ^ uVar29) >> 0x20 | (uVar26 ^ uVar29) << 0x20;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x18 | (uVar21 ^ uVar23) << 0x28;
  uVar29 = uVar29 + uVar21 + uVar10;
  uVar26 = (uVar26 ^ uVar29) >> 0x10 | (uVar26 ^ uVar29) << 0x30;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x3f | (uVar21 ^ uVar23) << 1;
  uVar19 = uVar19 + uVar21 + uVar13;
  uVar17 = (uVar17 ^ uVar19) >> 0x20 | (uVar17 ^ uVar19) << 0x20;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x18 | (uVar21 ^ uVar20) << 0x28;
  uVar19 = uVar19 + uVar21 + uVar6;
  uVar17 = (uVar17 ^ uVar19) >> 0x10 | (uVar17 ^ uVar19) << 0x30;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x3f | (uVar21 ^ uVar20) << 1;
  uVar22 = uVar22 + uVar24 + uVar2;
  uVar18 = (uVar18 ^ uVar22) >> 0x20 | (uVar18 ^ uVar22) << 0x20;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x18 | (uVar24 ^ uVar23) << 0x28;
  uVar22 = uVar22 + uVar24 + uVar16;
  uVar18 = (uVar18 ^ uVar22) >> 0x10 | (uVar18 ^ uVar22) << 0x30;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x3f | (uVar24 ^ uVar23) << 1;
  uVar25 = uVar25 + uVar28 + uVar15;
  uVar26 = (uVar26 ^ uVar25) >> 0x20 | (uVar26 ^ uVar25) << 0x20;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x18 | (uVar28 ^ uVar27) << 0x28;
  uVar25 = uVar25 + uVar28 + uVar14;
  uVar26 = (uVar26 ^ uVar25) >> 0x10 | (uVar26 ^ uVar25) << 0x30;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x3f | (uVar28 ^ uVar27) << 1;
  uVar29 = uVar29 + uVar32 + uVar5;
  uVar30 = (uVar30 ^ uVar29) >> 0x20 | (uVar30 ^ uVar29) << 0x20;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x18 | (uVar32 ^ uVar31) << 0x28;
  uVar29 = uVar29 + uVar32 + uVar11;
  uVar30 = (uVar30 ^ uVar29) >> 0x10 | (uVar30 ^ uVar29) << 0x30;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x3f | (uVar32 ^ uVar31) << 1;
  uVar19 = uVar19 + uVar24 + uVar1;
  uVar30 = (uVar30 ^ uVar19) >> 0x20 | (uVar30 ^ uVar19) << 0x20;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x18 | (uVar24 ^ uVar27) << 0x28;
  uVar19 = uVar19 + uVar24 + uVar8;
  uVar30 = (uVar30 ^ uVar19) >> 0x10 | (uVar30 ^ uVar19) << 0x30;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x3f | (uVar24 ^ uVar27) << 1;
  uVar22 = uVar22 + uVar28 + uVar7;
  uVar17 = (uVar17 ^ uVar22) >> 0x20 | (uVar17 ^ uVar22) << 0x20;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x18 | (uVar28 ^ uVar31) << 0x28;
  uVar22 = uVar22 + uVar28 + uVar4;
  uVar17 = (uVar17 ^ uVar22) >> 0x10 | (uVar17 ^ uVar22) << 0x30;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x3f | (uVar28 ^ uVar31) << 1;
  uVar25 = uVar25 + uVar32 + uVar10;
  uVar18 = (uVar18 ^ uVar25) >> 0x20 | (uVar18 ^ uVar25) << 0x20;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x18 | (uVar32 ^ uVar20) << 0x28;
  uVar25 = uVar25 + uVar32 + uVar3;
  uVar18 = (uVar18 ^ uVar25) >> 0x10 | (uVar18 ^ uVar25) << 0x30;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x3f | (uVar32 ^ uVar20) << 1;
  uVar29 = uVar29 + uVar21 + uVar9;
  uVar26 = (uVar26 ^ uVar29) >> 0x20 | (uVar26 ^ uVar29) << 0x20;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x18 | (uVar21 ^ uVar23) << 0x28;
  uVar29 = uVar29 + uVar21 + uVar12;
  uVar26 = (uVar26 ^ uVar29) >> 0x10 | (uVar26 ^ uVar29) << 0x30;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x3f | (uVar21 ^ uVar23) << 1;
  uVar19 = uVar19 + uVar21 + uVar14;
  uVar17 = (uVar17 ^ uVar19) >> 0x20 | (uVar17 ^ uVar19) << 0x20;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x18 | (uVar21 ^ uVar20) << 0x28;
  uVar19 = uVar19 + uVar21 + uVar12;
  uVar17 = (uVar17 ^ uVar19) >> 0x10 | (uVar17 ^ uVar19) << 0x30;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x3f | (uVar21 ^ uVar20) << 1;
  uVar22 = uVar22 + uVar24 + uVar8;
  uVar18 = (uVar18 ^ uVar22) >> 0x20 | (uVar18 ^ uVar22) << 0x20;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x18 | (uVar24 ^ uVar23) << 0x28;
  uVar22 = uVar22 + uVar24 + uVar15;
  uVar18 = (uVar18 ^ uVar22) >> 0x10 | (uVar18 ^ uVar22) << 0x30;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x3f | (uVar24 ^ uVar23) << 1;
  uVar25 = uVar25 + uVar28 + uVar13;
  uVar26 = (uVar26 ^ uVar25) >> 0x20 | (uVar26 ^ uVar25) << 0x20;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x18 | (uVar28 ^ uVar27) << 0x28;
  uVar25 = uVar25 + uVar28 + uVar2;
  uVar26 = (uVar26 ^ uVar25) >> 0x10 | (uVar26 ^ uVar25) << 0x30;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x3f | (uVar28 ^ uVar27) << 1;
  uVar29 = uVar29 + uVar32 + uVar4;
  uVar30 = (uVar30 ^ uVar29) >> 0x20 | (uVar30 ^ uVar29) << 0x20;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x18 | (uVar32 ^ uVar31) << 0x28;
  uVar29 = uVar29 + uVar32 + uVar10;
  uVar30 = (uVar30 ^ uVar29) >> 0x10 | (uVar30 ^ uVar29) << 0x30;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x3f | (uVar32 ^ uVar31) << 1;
  uVar19 = uVar19 + uVar24 + uVar6;
  uVar30 = (uVar30 ^ uVar19) >> 0x20 | (uVar30 ^ uVar19) << 0x20;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x18 | (uVar24 ^ uVar27) << 0x28;
  uVar19 = uVar19 + uVar24 + uVar1;
  uVar30 = (uVar30 ^ uVar19) >> 0x10 | (uVar30 ^ uVar19) << 0x30;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x3f | (uVar24 ^ uVar27) << 1;
  uVar22 = uVar22 + uVar28 + uVar16;
  uVar17 = (uVar17 ^ uVar22) >> 0x20 | (uVar17 ^ uVar22) << 0x20;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x18 | (uVar28 ^ uVar31) << 0x28;
  uVar22 = uVar22 + uVar28 + uVar5;
  uVar17 = (uVar17 ^ uVar22) >> 0x10 | (uVar17 ^ uVar22) << 0x30;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x3f | (uVar28 ^ uVar31) << 1;
  uVar25 = uVar25 + uVar32 + uVar9;
  uVar18 = (uVar18 ^ uVar25) >> 0x20 | (uVar18 ^ uVar25) << 0x20;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x18 | (uVar32 ^ uVar20) << 0x28;
  uVar25 = uVar25 + uVar32 + uVar7;
  uVar18 = (uVar18 ^ uVar25) >> 0x10 | (uVar18 ^ uVar25) << 0x30;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x3f | (uVar32 ^ uVar20) << 1;
  uVar29 = uVar29 + uVar21 + uVar3;
  uVar26 = (uVar26 ^ uVar29) >> 0x20 | (uVar26 ^ uVar29) << 0x20;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x18 | (uVar21 ^ uVar23) << 0x28;
  uVar29 = uVar29 + uVar21 + uVar11;
  uVar26 = (uVar26 ^ uVar29) >> 0x10 | (uVar26 ^ uVar29) << 0x30;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x3f | (uVar21 ^ uVar23) << 1;
  uVar19 = uVar19 + uVar21 + uVar7;
  uVar17 = (uVar17 ^ uVar19) >> 0x20 | (uVar17 ^ uVar19) << 0x20;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x18 | (uVar21 ^ uVar20) << 0x28;
  uVar19 = uVar19 + uVar21 + uVar16;
  uVar17 = (uVar17 ^ uVar19) >> 0x10 | (uVar17 ^ uVar19) << 0x30;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x3f | (uVar21 ^ uVar20) << 1;
  uVar22 = uVar22 + uVar24 + uVar15;
  uVar18 = (uVar18 ^ uVar22) >> 0x20 | (uVar18 ^ uVar22) << 0x20;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x18 | (uVar24 ^ uVar23) << 0x28;
  uVar22 = uVar22 + uVar24 + uVar10;
  uVar18 = (uVar18 ^ uVar22) >> 0x10 | (uVar18 ^ uVar22) << 0x30;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x3f | (uVar24 ^ uVar23) << 1;
  uVar25 = uVar25 + uVar28 + uVar12;
  uVar26 = (uVar26 ^ uVar25) >> 0x20 | (uVar26 ^ uVar25) << 0x20;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x18 | (uVar28 ^ uVar27) << 0x28;
  uVar25 = uVar25 + uVar28 + uVar4;
  uVar26 = (uVar26 ^ uVar25) >> 0x10 | (uVar26 ^ uVar25) << 0x30;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x3f | (uVar28 ^ uVar27) << 1;
  uVar29 = uVar29 + uVar32 + uVar1;
  uVar30 = (uVar30 ^ uVar29) >> 0x20 | (uVar30 ^ uVar29) << 0x20;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x18 | (uVar32 ^ uVar31) << 0x28;
  uVar29 = uVar29 + uVar32 + uVar9;
  uVar30 = (uVar30 ^ uVar29) >> 0x10 | (uVar30 ^ uVar29) << 0x30;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x3f | (uVar32 ^ uVar31) << 1;
  uVar19 = uVar19 + uVar24 + uVar13;
  uVar30 = (uVar30 ^ uVar19) >> 0x20 | (uVar30 ^ uVar19) << 0x20;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x18 | (uVar24 ^ uVar27) << 0x28;
  uVar19 = uVar19 + uVar24 + uVar3;
  uVar30 = (uVar30 ^ uVar19) >> 0x10 | (uVar30 ^ uVar19) << 0x30;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x3f | (uVar24 ^ uVar27) << 1;
  uVar22 = uVar22 + uVar28 + uVar14;
  uVar17 = (uVar17 ^ uVar22) >> 0x20 | (uVar17 ^ uVar22) << 0x20;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x18 | (uVar28 ^ uVar31) << 0x28;
  uVar22 = uVar22 + uVar28 + uVar8;
  uVar17 = (uVar17 ^ uVar22) >> 0x10 | (uVar17 ^ uVar22) << 0x30;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x3f | (uVar28 ^ uVar31) << 1;
  uVar25 = uVar25 + uVar32 + uVar2;
  uVar18 = (uVar18 ^ uVar25) >> 0x20 | (uVar18 ^ uVar25) << 0x20;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x18 | (uVar32 ^ uVar20) << 0x28;
  uVar25 = uVar25 + uVar32 + uVar5;
  uVar18 = (uVar18 ^ uVar25) >> 0x10 | (uVar18 ^ uVar25) << 0x30;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x3f | (uVar32 ^ uVar20) << 1;
  uVar29 = uVar29 + uVar21 + uVar11;
  uVar26 = (uVar26 ^ uVar29) >> 0x20 | (uVar26 ^ uVar29) << 0x20;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x18 | (uVar21 ^ uVar23) << 0x28;
  uVar29 = uVar29 + uVar21 + uVar6;
  uVar26 = (uVar26 ^ uVar29) >> 0x10 | (uVar26 ^ uVar29) << 0x30;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x3f | (uVar21 ^ uVar23) << 1;
  uVar19 = uVar19 + uVar21 + uVar11;
  uVar17 = (uVar17 ^ uVar19) >> 0x20 | (uVar17 ^ uVar19) << 0x20;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x18 | (uVar21 ^ uVar20) << 0x28;
  uVar19 = uVar19 + uVar21 + uVar3;
  uVar17 = (uVar17 ^ uVar19) >> 0x10 | (uVar17 ^ uVar19) << 0x30;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x3f | (uVar21 ^ uVar20) << 1;
  uVar22 = uVar22 + uVar24 + uVar9;
  uVar18 = (uVar18 ^ uVar22) >> 0x20 | (uVar18 ^ uVar22) << 0x20;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x18 | (uVar24 ^ uVar23) << 0x28;
  uVar22 = uVar22 + uVar24 + uVar5;
  uVar18 = (uVar18 ^ uVar22) >> 0x10 | (uVar18 ^ uVar22) << 0x30;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x3f | (uVar24 ^ uVar23) << 1;
  uVar25 = uVar25 + uVar28 + uVar8;
  uVar26 = (uVar26 ^ uVar25) >> 0x20 | (uVar26 ^ uVar25) << 0x20;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x18 | (uVar28 ^ uVar27) << 0x28;
  uVar25 = uVar25 + uVar28 + uVar7;
  uVar26 = (uVar26 ^ uVar25) >> 0x10 | (uVar26 ^ uVar25) << 0x30;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x3f | (uVar28 ^ uVar27) << 1;
  uVar29 = uVar29 + uVar32 + uVar2;
  uVar30 = (uVar30 ^ uVar29) >> 0x20 | (uVar30 ^ uVar29) << 0x20;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x18 | (uVar32 ^ uVar31) << 0x28;
  uVar29 = uVar29 + uVar32 + uVar6;
  uVar30 = (uVar30 ^ uVar29) >> 0x10 | (uVar30 ^ uVar29) << 0x30;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x3f | (uVar32 ^ uVar31) << 1;
  uVar19 = uVar19 + uVar24 + uVar16;
  uVar30 = (uVar30 ^ uVar19) >> 0x20 | (uVar30 ^ uVar19) << 0x20;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x18 | (uVar24 ^ uVar27) << 0x28;
  uVar19 = uVar19 + uVar24 + uVar12;
  uVar30 = (uVar30 ^ uVar19) >> 0x10 | (uVar30 ^ uVar19) << 0x30;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x3f | (uVar24 ^ uVar27) << 1;
  uVar22 = uVar22 + uVar28 + uVar10;
  uVar17 = (uVar17 ^ uVar22) >> 0x20 | (uVar17 ^ uVar22) << 0x20;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x18 | (uVar28 ^ uVar31) << 0x28;
  uVar22 = uVar22 + uVar28 + uVar15;
  uVar17 = (uVar17 ^ uVar22) >> 0x10 | (uVar17 ^ uVar22) << 0x30;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x3f | (uVar28 ^ uVar31) << 1;
  uVar25 = uVar25 + uVar32 + uVar4;
  uVar18 = (uVar18 ^ uVar25) >> 0x20 | (uVar18 ^ uVar25) << 0x20;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x18 | (uVar32 ^ uVar20) << 0x28;
  uVar25 = uVar25 + uVar32 + uVar13;
  uVar18 = (uVar18 ^ uVar25) >> 0x10 | (uVar18 ^ uVar25) << 0x30;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x3f | (uVar32 ^ uVar20) << 1;
  uVar29 = uVar29 + uVar21 + uVar14;
  uVar26 = (uVar26 ^ uVar29) >> 0x20 | (uVar26 ^ uVar29) << 0x20;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x18 | (uVar21 ^ uVar23) << 0x28;
  uVar29 = uVar29 + uVar21 + uVar1;
  uVar26 = (uVar26 ^ uVar29) >> 0x10 | (uVar26 ^ uVar29) << 0x30;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x3f | (uVar21 ^ uVar23) << 1;
  uVar19 = uVar19 + uVar21 + uVar1;
  uVar17 = (uVar17 ^ uVar19) >> 0x20 | (uVar17 ^ uVar19) << 0x20;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x18 | (uVar21 ^ uVar20) << 0x28;
  uVar19 = uVar19 + uVar21 + uVar2;
  uVar17 = (uVar17 ^ uVar19) >> 0x10 | (uVar17 ^ uVar19) << 0x30;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x3f | (uVar21 ^ uVar20) << 1;
  uVar22 = uVar22 + uVar24 + uVar3;
  uVar18 = (uVar18 ^ uVar22) >> 0x20 | (uVar18 ^ uVar22) << 0x20;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x18 | (uVar24 ^ uVar23) << 0x28;
  uVar22 = uVar22 + uVar24 + uVar4;
  uVar18 = (uVar18 ^ uVar22) >> 0x10 | (uVar18 ^ uVar22) << 0x30;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x3f | (uVar24 ^ uVar23) << 1;
  uVar25 = uVar25 + uVar28 + uVar5;
  uVar26 = (uVar26 ^ uVar25) >> 0x20 | (uVar26 ^ uVar25) << 0x20;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x18 | (uVar28 ^ uVar27) << 0x28;
  uVar25 = uVar25 + uVar28 + uVar6;
  uVar26 = (uVar26 ^ uVar25) >> 0x10 | (uVar26 ^ uVar25) << 0x30;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x3f | (uVar28 ^ uVar27) << 1;
  uVar29 = uVar29 + uVar32 + uVar7;
  uVar30 = (uVar30 ^ uVar29) >> 0x20 | (uVar30 ^ uVar29) << 0x20;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x18 | (uVar32 ^ uVar31) << 0x28;
  uVar29 = uVar29 + uVar32 + uVar8;
  uVar30 = (uVar30 ^ uVar29) >> 0x10 | (uVar30 ^ uVar29) << 0x30;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x3f | (uVar32 ^ uVar31) << 1;
  uVar19 = uVar19 + uVar24 + uVar9;
  uVar30 = (uVar30 ^ uVar19) >> 0x20 | (uVar30 ^ uVar19) << 0x20;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x18 | (uVar24 ^ uVar27) << 0x28;
  uVar19 = uVar19 + uVar24 + uVar10;
  uVar30 = (uVar30 ^ uVar19) >> 0x10 | (uVar30 ^ uVar19) << 0x30;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x3f | (uVar24 ^ uVar27) << 1;
  uVar22 = uVar22 + uVar28 + uVar11;
  uVar17 = (uVar17 ^ uVar22) >> 0x20 | (uVar17 ^ uVar22) << 0x20;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x18 | (uVar28 ^ uVar31) << 0x28;
  uVar22 = uVar22 + uVar28 + uVar12;
  uVar17 = (uVar17 ^ uVar22) >> 0x10 | (uVar17 ^ uVar22) << 0x30;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x3f | (uVar28 ^ uVar31) << 1;
  uVar25 = uVar25 + uVar32 + uVar13;
  uVar18 = (uVar18 ^ uVar25) >> 0x20 | (uVar18 ^ uVar25) << 0x20;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x18 | (uVar32 ^ uVar20) << 0x28;
  uVar25 = uVar25 + uVar32 + uVar14;
  uVar18 = (uVar18 ^ uVar25) >> 0x10 | (uVar18 ^ uVar25) << 0x30;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x3f | (uVar32 ^ uVar20) << 1;
  uVar29 = uVar29 + uVar21 + uVar15;
  uVar26 = (uVar26 ^ uVar29) >> 0x20 | (uVar26 ^ uVar29) << 0x20;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x18 | (uVar21 ^ uVar23) << 0x28;
  uVar29 = uVar29 + uVar21 + uVar16;
  uVar26 = (uVar26 ^ uVar29) >> 0x10 | (uVar26 ^ uVar29) << 0x30;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x3f | (uVar21 ^ uVar23) << 1;
  uVar19 = uVar19 + uVar21 + uVar15;
  uVar17 = (uVar17 ^ uVar19) >> 0x20 | (uVar17 ^ uVar19) << 0x20;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x18 | (uVar21 ^ uVar20) << 0x28;
  uVar19 = uVar19 + uVar21 + uVar11;
  uVar17 = (uVar17 ^ uVar19) >> 0x10 | (uVar17 ^ uVar19) << 0x30;
  uVar20 = uVar20 + uVar17;
  uVar21 = (uVar21 ^ uVar20) >> 0x3f | (uVar21 ^ uVar20) << 1;
  uVar22 = uVar22 + uVar24 + uVar5;
  uVar18 = (uVar18 ^ uVar22) >> 0x20 | (uVar18 ^ uVar22) << 0x20;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x18 | (uVar24 ^ uVar23) << 0x28;
  uVar22 = uVar22 + uVar24 + uVar9;
  uVar18 = (uVar18 ^ uVar22) >> 0x10 | (uVar18 ^ uVar22) << 0x30;
  uVar23 = uVar23 + uVar18;
  uVar24 = (uVar24 ^ uVar23) >> 0x3f | (uVar24 ^ uVar23) << 1;
  uVar25 = uVar25 + uVar28 + uVar10;
  uVar26 = (uVar26 ^ uVar25) >> 0x20 | (uVar26 ^ uVar25) << 0x20;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x18 | (uVar28 ^ uVar27) << 0x28;
  uVar25 = uVar25 + uVar28 + uVar16;
  uVar26 = (uVar26 ^ uVar25) >> 0x10 | (uVar26 ^ uVar25) << 0x30;
  uVar27 = uVar27 + uVar26;
  uVar28 = (uVar28 ^ uVar27) >> 0x3f | (uVar28 ^ uVar27) << 1;
  uVar29 = uVar29 + uVar32 + uVar14;
  uVar30 = (uVar30 ^ uVar29) >> 0x20 | (uVar30 ^ uVar29) << 0x20;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x18 | (uVar32 ^ uVar31) << 0x28;
  uVar29 = uVar29 + uVar32 + uVar7;
  uVar30 = (uVar30 ^ uVar29) >> 0x10 | (uVar30 ^ uVar29) << 0x30;
  uVar31 = uVar31 + uVar30;
  uVar32 = (uVar32 ^ uVar31) >> 0x3f | (uVar32 ^ uVar31) << 1;
  uVar19 = uVar19 + uVar24 + uVar2;
  uVar30 = (uVar30 ^ uVar19) >> 0x20 | (uVar30 ^ uVar19) << 0x20;
  uVar27 = uVar27 + uVar30;
  uVar24 = (uVar24 ^ uVar27) >> 0x18 | (uVar24 ^ uVar27) << 0x28;
  uVar19 = uVar19 + uVar24 + uVar13;
  uVar30 = (uVar30 ^ uVar19) >> 0x10 | (uVar30 ^ uVar19) << 0x30;
  uVar27 = uVar27 + uVar30;
  uVar22 = uVar22 + uVar28 + uVar1;
  uVar17 = (uVar17 ^ uVar22) >> 0x20 | (uVar17 ^ uVar22) << 0x20;
  uVar31 = uVar31 + uVar17;
  uVar28 = (uVar28 ^ uVar31) >> 0x18 | (uVar28 ^ uVar31) << 0x28;
  uVar22 = uVar22 + uVar28 + uVar3;
  uVar17 = (uVar17 ^ uVar22) >> 0x10 | (uVar17 ^ uVar22) << 0x30;
  uVar31 = uVar31 + uVar17;
  uVar25 = uVar25 + uVar32 + uVar12;
  uVar18 = (uVar18 ^ uVar25) >> 0x20 | (uVar18 ^ uVar25) << 0x20;
  uVar20 = uVar20 + uVar18;
  uVar32 = (uVar32 ^ uVar20) >> 0x18 | (uVar32 ^ uVar20) << 0x28;
  uVar25 = uVar25 + uVar32 + uVar8;
  uVar18 = (uVar18 ^ uVar25) >> 0x10 | (uVar18 ^ uVar25) << 0x30;
  uVar20 = uVar20 + uVar18;
  uVar29 = uVar29 + uVar21 + uVar6;
  uVar26 = (uVar26 ^ uVar29) >> 0x20 | (uVar26 ^ uVar29) << 0x20;
  uVar23 = uVar23 + uVar26;
  uVar21 = (uVar21 ^ uVar23) >> 0x18 | (uVar21 ^ uVar23) << 0x28;
  uVar29 = uVar29 + uVar21 + uVar4;
  uVar26 = (uVar26 ^ uVar29) >> 0x10 | (uVar26 ^ uVar29) << 0x30;
  uVar23 = uVar23 + uVar26;
  S->h[0] = uVar19 ^ uVar20 ^ S->h[0];
  S->h[1] = uVar22 ^ uVar23 ^ S->h[1];
  S->h[2] = uVar25 ^ uVar27 ^ S->h[2];
  S->h[3] = uVar29 ^ uVar31 ^ S->h[3];
  S->h[4] = ((uVar21 ^ uVar23) >> 0x3f | (uVar21 ^ uVar23) << 1) ^ uVar17 ^ S->h[4];
  S->h[5] = ((uVar24 ^ uVar27) >> 0x3f | (uVar24 ^ uVar27) << 1) ^ uVar18 ^ S->h[5];
  S->h[6] = ((uVar28 ^ uVar31) >> 0x3f | (uVar28 ^ uVar31) << 1) ^ uVar26 ^ S->h[6];
  S->h[7] = ((uVar32 ^ uVar20) >> 0x3f | (uVar32 ^ uVar20) << 1) ^ uVar30 ^ S->h[7];
  return;
}

Assistant:

void blake2b_compress(blake2b_state *S, const void *block, uint64_t f0)
{
    uint64_t m[16];
    uint64_t v[16];

    m[ 0] = load64((const uint64_t *)block +  0);
    m[ 1] = load64((const uint64_t *)block +  1);
    m[ 2] = load64((const uint64_t *)block +  2);
    m[ 3] = load64((const uint64_t *)block +  3);
    m[ 4] = load64((const uint64_t *)block +  4);
    m[ 5] = load64((const uint64_t *)block +  5);
    m[ 6] = load64((const uint64_t *)block +  6);
    m[ 7] = load64((const uint64_t *)block +  7);
    m[ 8] = load64((const uint64_t *)block +  8);
    m[ 9] = load64((const uint64_t *)block +  9);
    m[10] = load64((const uint64_t *)block + 10);
    m[11] = load64((const uint64_t *)block + 11);
    m[12] = load64((const uint64_t *)block + 12);
    m[13] = load64((const uint64_t *)block + 13);
    m[14] = load64((const uint64_t *)block + 14);
    m[15] = load64((const uint64_t *)block + 15);

    v[ 0] = S->h[0];
    v[ 1] = S->h[1];
    v[ 2] = S->h[2];
    v[ 3] = S->h[3];
    v[ 4] = S->h[4];
    v[ 5] = S->h[5];
    v[ 6] = S->h[6];
    v[ 7] = S->h[7];
    v[ 8] = blake2b_IV[0];
    v[ 9] = blake2b_IV[1];
    v[10] = blake2b_IV[2];
    v[11] = blake2b_IV[3];
    v[12] = blake2b_IV[4] ^ S->t[0];
    v[13] = blake2b_IV[5] ^ S->t[1];
    v[14] = blake2b_IV[6] ^ f0;
    v[15] = blake2b_IV[7];

    ROUND(m, v, 0);
    ROUND(m, v, 1);
    ROUND(m, v, 2);
    ROUND(m, v, 3);
    ROUND(m, v, 4);
    ROUND(m, v, 5);
    ROUND(m, v, 6);
    ROUND(m, v, 7);
    ROUND(m, v, 8);
    ROUND(m, v, 9);
    ROUND(m, v, 10);
    ROUND(m, v, 11);

    S->h[0] ^= v[0] ^ v[ 8];
    S->h[1] ^= v[1] ^ v[ 9];
    S->h[2] ^= v[2] ^ v[10];
    S->h[3] ^= v[3] ^ v[11];
    S->h[4] ^= v[4] ^ v[12];
    S->h[5] ^= v[5] ^ v[13];
    S->h[6] ^= v[6] ^ v[14];
    S->h[7] ^= v[7] ^ v[15];
}